

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_aggsig_verify_callback(secp256k1_scalar *sc,secp256k1_ge *pt,size_t idx,void *data)

{
  int iVar1;
  
  iVar1 = secp256k1_compute_sighash(sc,(uchar *)((long)data + 8),idx);
  if (iVar1 != 0) {
    secp256k1_scalar_negate(sc,sc);
    secp256k1_pubkey_load(*data,pt,(secp256k1_pubkey *)(idx * 0x40 + *(long *)((long)data + 0x48)));
  }
  return (uint)(iVar1 != 0);
}

Assistant:

static int secp256k1_aggsig_verify_callback(secp256k1_scalar *sc, secp256k1_ge *pt, size_t idx, void *data) {
    secp256k1_verify_callback_data *cbdata = (secp256k1_verify_callback_data*) data;

    if (secp256k1_compute_sighash(sc, cbdata->prehash, idx) == 0) {
        return 0;
    }
    secp256k1_scalar_negate(sc, sc);
    secp256k1_pubkey_load(cbdata->ctx, pt, &cbdata->pubkeys[idx]);
    return 1;
}